

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void biflen(bifcxdef *ctx,int argc)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  long in_RDI;
  int cursiz;
  int l;
  long len;
  runsdef val;
  uchar *p;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  runcxdef *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  void *p_00;
  dattyp typ;
  undefined4 in_stack_ffffffffffffffc0;
  int local_34;
  
  uVar2 = (uint)*(byte *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10);
  if (uVar2 == 3) {
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x03') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    p_00 = *(void **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    osrp2(p_00);
    typ = (dattyp)((ulong)p_00 >> 0x20);
  }
  else {
    if (uVar2 != 7) {
      *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "length";
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
      runsign(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\a') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    in_stack_ffffffffffffffb0 = *(runcxdef **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    local_34 = osrp2(in_stack_ffffffffffffffb0);
    for (local_34 = local_34 + -2; typ = (dattyp)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
        local_34 != 0; local_34 = local_34 - (uVar3 + 1)) {
      uVar3 = datsiz((dattyp)in_stack_ffffffffffffffb0,
                     (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
  }
  runpush((runcxdef *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),typ,
          (runsdef *)in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void biflen(bifcxdef *ctx, int argc)
{
    uchar   *p;
    runsdef  val;
    long     len;
    int      l;
    
    bifcntargs(ctx, 1, argc);
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_SSTRING:
        p = (uchar *)runpopstr(ctx->bifcxrun);
        len = osrp2(p) - 2;
        break;

    case DAT_LIST:
        p = runpoplst(ctx->bifcxrun);
        l = osrp2(p) - 2;
        p += 2;
        
        /* count all elements in list */
        for (len = 0 ; l ; ++len)
        {
            int cursiz;
            
            /* get size of this element, and move past it */
            cursiz = datsiz(*p, p+1) + 1;
            l -= cursiz;
            p += cursiz;
        }
        break;

    default:
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "length");
    }
    
    val.runsv.runsvnum = len;
    runpush(ctx->bifcxrun, DAT_NUMBER, &val);
}